

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall
helics::CoreApp::CoreApp
          (CoreApp *this,CoreType ctype,string_view coreName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  pointer this_00;
  CoreType in_ESI;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_RDI;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_00000038;
  CoreApp *in_stack_00000040;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000048;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x463ff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  generateParser((CoreApp *)coreName._M_len);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x464050);
  helicsCLI11App::setDefaultCoreType(this_00,in_ESI);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x464068);
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((helicsCLI11App *)args,in_stack_00000048);
  if (PVar1 == OK) {
    processArgs(in_stack_00000040,in_stack_00000038);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr(in_RDI);
  return;
}

Assistant:

CoreApp::CoreApp(CoreType ctype, std::string_view coreName, std::vector<std::string> args):
    name(coreName)
{
    auto app = generateParser();
    app->setDefaultCoreType(ctype);
    if (app->helics_parse(std::move(args)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}